

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_2cc340::HandleCopyFile
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  int iVar3;
  CopyResult CVar4;
  size_type sVar5;
  const_reference pvVar6;
  cmMakefile *pcVar7;
  string *psVar8;
  cmArgumentParser<(anonymous_namespace)::HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  *this;
  cmArgumentParser<Arguments> *pcVar9;
  reference __rhs;
  ulong uVar10;
  static_string_view sVar11;
  cmAlphaNum local_498;
  cmAlphaNum local_468;
  string local_438;
  string_view local_418;
  string_view local_408;
  undefined1 local_3f8 [8];
  string err;
  undefined1 local_3d0 [4];
  CopyWhen when;
  cmAlphaNum local_3a0;
  string local_370;
  string_view local_350;
  cmAlphaNum local_340;
  cmAlphaNum local_310;
  string local_2e0;
  string_view local_2c0;
  byte local_2ad;
  undefined4 local_2ac;
  undefined1 local_2a8 [3];
  bool result;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_288;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_278;
  undefined1 local_268 [8];
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  cmArgumentParser<Arguments> local_208;
  cmAlphaNum local_198;
  cmAlphaNum local_168;
  string local_138;
  undefined1 local_118 [8];
  string newname;
  cmAlphaNum local_c8;
  string local_98;
  undefined1 local_78 [8];
  string oldname;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar1 = local_20;
  if (sVar5 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"COPY_FILE must be called with at least two additional arguments"
               ,&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    std::__cxx11::string::string((string *)local_78,(string *)pvVar6);
    bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_78);
    if (!bVar2) {
      pcVar7 = cmExecutionStatus::GetMakefile(local_20);
      psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar7);
      cmAlphaNum::cmAlphaNum(&local_c8,psVar8);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&newname.field_2 + 8),'/');
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,1);
      cmStrCat<std::__cxx11::string>
                (&local_98,&local_c8,(cmAlphaNum *)((long)&newname.field_2 + 8),pvVar6);
      std::__cxx11::string::operator=((string *)local_78,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    std::__cxx11::string::string((string *)local_118,(string *)pvVar6);
    bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_118);
    if (!bVar2) {
      pcVar7 = cmExecutionStatus::GetMakefile(local_20);
      psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar7);
      cmAlphaNum::cmAlphaNum(&local_168,psVar8);
      cmAlphaNum::cmAlphaNum(&local_198,'/');
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,2);
      cmStrCat<std::__cxx11::string>(&local_138,&local_168,&local_198,pvVar6);
      std::__cxx11::string::operator=((string *)local_118,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
    }
    if (((anonymous_namespace)::
         HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::parser == '\0') &&
       (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::parser), iVar3 != 0)) {
      local_208.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_208.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
      local_208.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
      local_208.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager =
           (_Manager_type)0x0;
      local_208.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
      local_208.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused.
      _M_object = (void *)0x0;
      local_208.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
      local_208.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
           (_Manager_type)0x0;
      local_208.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_208.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
      _M_object = (void *)0x0;
      local_208.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cmArgumentParser<Arguments>::cmArgumentParser(&local_208);
      sVar11 = ::cm::operator____s("ONLY_IF_DIFFERENT",0x11);
      this = (cmArgumentParser<(anonymous_namespace)::HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<Arguments>::Bind<bool>(&local_208,sVar11,0);
      sVar11 = ::cm::operator____s("RESULT",6);
      pcVar9 = cmArgumentParser<(anonymous_namespace)::HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
               ::Bind<std::__cxx11::string>(this,sVar11,8);
      cmArgumentParser<Arguments>::cmArgumentParser(&HandleCopyFile::parser,pcVar9);
      cmArgumentParser<Arguments>::~cmArgumentParser(&local_208);
      __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleCopyFile::parser,
                   &__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&arguments.Result.field_2 + 8));
    local_288 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local);
    local_278 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::advance(&local_288,3);
    cmArgumentParser<(anonymous_namespace)::HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((Arguments *)local_268,
               (cmArgumentParser<(anonymous_namespace)::HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&HandleCopyFile::parser,&local_278,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&arguments.Result.field_2 + 8),0);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&arguments.Result.field_2 + 8));
    pcVar1 = local_20;
    if (bVar2) {
      local_2ad = 1;
      bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_78);
      if (bVar2) {
        uVar10 = std::__cxx11::string::empty();
        pcVar1 = local_20;
        if ((uVar10 & 1) == 0) {
          pcVar7 = cmExecutionStatus::GetMakefile(local_20);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_2c0,"cannot copy a directory");
          cmMakefile::AddDefinition(pcVar7,(string *)&arguments,local_2c0);
        }
        else {
          cmAlphaNum::cmAlphaNum(&local_310,"COPY_FILE cannot copy a directory\n  ");
          cmAlphaNum::cmAlphaNum(&local_340,(string *)local_78);
          cmStrCat<>(&local_2e0,&local_310,&local_340);
          cmExecutionStatus::SetError(pcVar1,&local_2e0);
          std::__cxx11::string::~string((string *)&local_2e0);
          local_2ad = 0;
        }
        args_local._7_1_ = local_2ad & 1;
        local_2ac = 1;
      }
      else {
        bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_118);
        if (bVar2) {
          uVar10 = std::__cxx11::string::empty();
          pcVar1 = local_20;
          if ((uVar10 & 1) == 0) {
            pcVar7 = cmExecutionStatus::GetMakefile(local_20);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_350,"cannot copy to a directory");
            cmMakefile::AddDefinition(pcVar7,(string *)&arguments,local_350);
          }
          else {
            cmAlphaNum::cmAlphaNum(&local_3a0,"COPY_FILE cannot copy to a directory\n  ");
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_3d0,(string *)local_118);
            cmStrCat<>(&local_370,&local_3a0,(cmAlphaNum *)local_3d0);
            cmExecutionStatus::SetError(pcVar1,&local_370);
            std::__cxx11::string::~string((string *)&local_370);
            local_2ad = 0;
          }
          args_local._7_1_ = local_2ad & 1;
          local_2ac = 1;
        }
        else {
          err.field_2._13_3_ = 0;
          err.field_2._M_local_buf[0xc] = (local_268[0] & 1U) != 0;
          std::__cxx11::string::string((string *)local_3f8);
          CVar4 = cmSystemTools::CopySingleFile
                            ((string *)local_78,(string *)local_118,err.field_2._12_4_,
                             (string *)local_3f8);
          if (CVar4 == Success) {
            uVar10 = std::__cxx11::string::empty();
            if ((uVar10 & 1) == 0) {
              pcVar7 = cmExecutionStatus::GetMakefile(local_20);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_408,"0");
              cmMakefile::AddDefinition(pcVar7,(string *)&arguments,local_408);
            }
          }
          else {
            uVar10 = std::__cxx11::string::empty();
            pcVar1 = local_20;
            if ((uVar10 & 1) == 0) {
              pcVar7 = cmExecutionStatus::GetMakefile(local_20);
              local_418 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)local_3f8);
              cmMakefile::AddDefinition(pcVar7,(string *)&arguments,local_418);
            }
            else {
              cmAlphaNum::cmAlphaNum(&local_468,"COPY_FILE failed to copy\n  ");
              cmAlphaNum::cmAlphaNum(&local_498,(string *)local_78);
              cmStrCat<char[7],std::__cxx11::string,char[11],std::__cxx11::string,char[2]>
                        (&local_438,&local_468,&local_498,(char (*) [7])"\nto\n  ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_118,(char (*) [11])"\nbecause: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3f8,(char (*) [2])0xbf07de);
              cmExecutionStatus::SetError(pcVar1,&local_438);
              std::__cxx11::string::~string((string *)&local_438);
              local_2ad = 0;
            }
          }
          args_local._7_1_ = local_2ad & 1;
          local_2ac = 1;
          std::__cxx11::string::~string((string *)local_3f8);
        }
      }
    }
    else {
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&arguments.Result.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                     "COPY_FILE unknown argument:\n  ",__rhs);
      cmExecutionStatus::SetError(pcVar1,(string *)local_2a8);
      std::__cxx11::string::~string((string *)local_2a8);
      args_local._7_1_ = 0;
      local_2ac = 1;
    }
    HandleCopyFile::Arguments::~Arguments((Arguments *)local_268);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&arguments.Result.field_2 + 8));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)local_78);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleCopyFile(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("COPY_FILE must be called with at least two additional "
                    "arguments");
    return false;
  }

  // Compute full path for old and new names.
  std::string oldname = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(oldname)) {
    oldname =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }
  std::string newname = args[2];
  if (!cmsys::SystemTools::FileIsFullPath(newname)) {
    newname =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[2]);
  }

  struct Arguments
  {
    bool OnlyIfDifferent = false;
    std::string Result;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("ONLY_IF_DIFFERENT"_s, &Arguments::OnlyIfDifferent)
      .Bind("RESULT"_s, &Arguments::Result);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);
  if (!unconsumedArgs.empty()) {
    status.SetError("COPY_FILE unknown argument:\n  " +
                    unconsumedArgs.front());
    return false;
  }

  bool result = true;
  if (cmsys::SystemTools::FileIsDirectory(oldname)) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result,
                                         "cannot copy a directory");
    } else {
      status.SetError(
        cmStrCat("COPY_FILE cannot copy a directory\n  ", oldname));
      result = false;
    }
    return result;
  }
  if (cmsys::SystemTools::FileIsDirectory(newname)) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result,
                                         "cannot copy to a directory");
    } else {
      status.SetError(
        cmStrCat("COPY_FILE cannot copy to a directory\n  ", newname));
      result = false;
    }
    return result;
  }

  cmSystemTools::CopyWhen when;
  if (arguments.OnlyIfDifferent) {
    when = cmSystemTools::CopyWhen::OnlyIfDifferent;
  } else {
    when = cmSystemTools::CopyWhen::Always;
  }

  std::string err;
  if (cmSystemTools::CopySingleFile(oldname, newname, when, &err) ==
      cmSystemTools::CopyResult::Success) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, "0");
    }
  } else {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, err);
    } else {
      status.SetError(cmStrCat("COPY_FILE failed to copy\n  ", oldname,
                               "\nto\n  ", newname, "\nbecause: ", err, "\n"));
      result = false;
    }
  }

  return result;
}